

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtGC.c
# Opt level: O0

newtObjRef NewtObjChainAlloc(newtPool pool,size_t size,size_t dataSize)

{
  newtObjRef_conflict pnVar1;
  uint8_t *data;
  newtObjRef obj;
  size_t dataSize_local;
  size_t size_local;
  newtPool pool_local;
  
  NewtCheckGC(pool,size + dataSize);
  pool_local = (newtPool)NewtMemAlloc(pool,size);
  if (pool_local == (newtPool)0x0) {
    pool_local = (newtPool)0x0;
  }
  else {
    memset(pool_local,0,0x10);
    if (dataSize == 0) {
      ((newtObjHeader *)&pool_local->pool)->size = 0;
      ((newtObjHeader *)&pool_local->pool)->flags = 0x40;
    }
    else {
      pnVar1 = (newtObjRef_conflict)NewtMemAlloc(pool,dataSize);
      if (pnVar1 == (newtObjRef_conflict)0x0) {
        NewtMemFree(pool_local);
        return (newtObjRef)0x0;
      }
      pool_local->obj = pnVar1;
    }
    if (pool != (newtPool)0x0) {
      NewtPoolChain(pool,(newtObjRef)pool_local,dataSize == 0);
      pool->usesize = pool->usesize + (int)size + (int)dataSize;
    }
  }
  return (newtObjRef)pool_local;
}

Assistant:

newtObjRef NewtObjChainAlloc(newtPool pool, size_t size, size_t dataSize)
{
    newtObjRef	obj;
    
    NewtCheckGC(pool, size + dataSize);
    
    obj = (newtObjRef)NewtMemAlloc(pool, size);
    if (obj == NULL) return NULL;
    
    memset(&obj->header, 0, sizeof(obj->header));
    
    if (0 < dataSize)
    {
        uint8_t *	data;
        
        data = NewtMemAlloc(pool, dataSize);
        
        if (data == NULL)
        {
            NewtMemFree(obj);
            return NULL;
        }
        
        *((uint8_t **)(obj + 1)) = data;
    }
    else
    {
        obj->header.size = 0;
        obj->header.flags = kNewtObjLiteral;
    }
    
    if (pool != NULL)
    {
        NewtPoolChain(pool, obj, dataSize == 0);
        pool->usesize += size + dataSize;
    }
    
    return obj;
}